

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

size_t luaO_str2num(char *s,TValue *o)

{
  TValue *io_1;
  TValue *io;
  char *e;
  lua_Number n;
  lua_Integer i;
  TValue *o_local;
  char *s_local;
  
  i = (lua_Integer)o;
  o_local = (TValue *)s;
  io = (TValue *)l_str2int(s,(lua_Integer *)&n);
  if (io == (TValue *)0x0) {
    io = (TValue *)l_str2d((char *)o_local,(lua_Number *)&e);
    if (io == (TValue *)0x0) {
      return 0;
    }
    *(char **)i = e;
    *(undefined2 *)(i + 8) = 3;
  }
  else {
    *(lua_Number *)i = n;
    *(undefined2 *)(i + 8) = 0x13;
  }
  return (long)io + (1 - (long)o_local);
}

Assistant:

size_t luaO_str2num (const char *s, TValue *o) {
  lua_Integer i; lua_Number n;
  const char *e;
  if ((e = l_str2int(s, &i)) != NULL) {  /* try as an integer */
    setivalue(o, i);
  }
  else if ((e = l_str2d(s, &n)) != NULL) {  /* else try as a float */
    setfltvalue(o, n);
  }
  else
    return 0;  /* conversion failed */
  return (e - s) + 1;  /* success; return string size */
}